

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O2

void __thiscall wasm::CodeFolding::~CodeFolding(CodeFolding *this)

{
  (this->
  super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__CodeFolding_00e1dd10;
  std::
  _Rb_tree<wasm::Expression_*,_wasm::Expression_*,_std::_Identity<wasm::Expression_*>,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  ::~_Rb_tree(&(this->modifieds)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&(this->unoptimizables)._M_t);
  std::_Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
  ~_Vector_base(&(this->returnTails).
                 super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
               );
  std::_Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
  ~_Vector_base(&(this->unreachableTails).
                 super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
               );
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>_>
  ::~_Rb_tree(&(this->breakTails)._M_t);
  WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>::
  ~WalkerPass(&this->
               super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
             );
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }